

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

size_t cali_channel_pull_snapshot(cali_id_t chn_id,int param_2,size_t len,uchar *buf)

{
  bool bVar1;
  ChannelBody *chB;
  SnapshotBuilder *rec_00;
  ostream *poVar2;
  void *this;
  size_t n;
  Entry *entrylist;
  SnapshotView SVar3;
  undefined1 local_1038 [8];
  SnapshotView view;
  CompressedSnapshotRecord rec;
  SnapshotView local_be0;
  undefined1 local_bd0 [8];
  Channel channel;
  FixedSizeSnapshotRecord<120UL> snapshot;
  undefined1 local_50 [8];
  Caliper c;
  uchar *buf_local;
  size_t len_local;
  int param_1_local;
  cali_id_t chn_id_local;
  
  c._24_8_ = buf;
  cali::Caliper::sigsafe_instance();
  bVar1 = cali::Caliper::operator_cast_to_bool((Caliper *)local_50);
  if (bVar1) {
    cali::FixedSizeSnapshotRecord<120UL>::FixedSizeSnapshotRecord
              ((FixedSizeSnapshotRecord<120UL> *)
               &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cali::Caliper::get_channel((Caliper *)local_bd0,(cali_id_t)local_50);
    bVar1 = cali::Channel::operator_cast_to_bool((Channel *)local_bd0);
    if (bVar1) {
      chB = cali::Channel::body((Channel *)local_bd0);
      cali::SnapshotView::SnapshotView(&local_be0);
      rec_00 = cali::FixedSizeSnapshotRecord<120UL>::builder
                         ((FixedSizeSnapshotRecord<120UL> *)
                          &channel.mP.
                           super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      cali::Caliper::pull_snapshot((Caliper *)local_50,chB,local_be0,rec_00);
    }
    else {
      cali::Log::Log((Log *)&rec.m_skipped,0);
      poVar2 = cali::Log::stream((Log *)&rec.m_skipped);
      poVar2 = std::operator<<(poVar2,"cali_channel_pull_snapshot(): invalid channel id ");
      this = (void *)std::ostream::operator<<(poVar2,chn_id);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      cali::Log::~Log((Log *)&rec.m_skipped);
    }
    cali::CompressedSnapshotRecord::CompressedSnapshotRecord
              ((CompressedSnapshotRecord *)&view.m_len,len,(uchar *)c._24_8_);
    SVar3 = cali::FixedSizeSnapshotRecord<120UL>::view
                      ((FixedSizeSnapshotRecord<120UL> *)
                       &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
    view.m_data = (Entry *)SVar3.m_len;
    local_1038 = (undefined1  [8])SVar3.m_data;
    n = cali::SnapshotView::size((SnapshotView *)local_1038);
    entrylist = cali::SnapshotView::data((SnapshotView *)local_1038);
    cali::CompressedSnapshotRecord::append((CompressedSnapshotRecord *)&view.m_len,n,entrylist);
    chn_id_local = cali::CompressedSnapshotRecord::needed_len
                             ((CompressedSnapshotRecord *)&view.m_len);
    cali::CompressedSnapshotRecord::~CompressedSnapshotRecord
              ((CompressedSnapshotRecord *)&view.m_len);
    cali::Channel::~Channel((Channel *)local_bd0);
  }
  else {
    chn_id_local = 0;
  }
  cali::Caliper::~Caliper((Caliper *)local_50);
  return chn_id_local;
}

Assistant:

size_t cali_channel_pull_snapshot(cali_id_t chn_id, int /* scopes */, size_t len, unsigned char* buf)
{
    Caliper c = Caliper::sigsafe_instance();

    if (!c)
        return 0;

    FixedSizeSnapshotRecord<SNAP_MAX> snapshot;
    Channel                           channel = c.get_channel(chn_id);

    if (channel)
        c.pull_snapshot(channel.body(), SnapshotView(), snapshot.builder());
    else
        Log(0).stream() << "cali_channel_pull_snapshot(): invalid channel id " << chn_id << std::endl;

    CompressedSnapshotRecord rec(len, buf);
    SnapshotView             view(snapshot.view());
    rec.append(view.size(), view.data());

    return rec.needed_len();
}